

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

Maybe<unsigned_long> __thiscall kj::StringPtr::findLast(StringPtr *this,char c)

{
  char *pcVar1;
  char in_DL;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar2;
  undefined7 in_register_00000031;
  ArrayPtr<const_char> *this_00;
  Maybe<unsigned_long> MVar3;
  unsigned_long local_30;
  size_t local_28;
  size_t i;
  ArrayPtr<const_char> *pAStack_18;
  char c_local;
  StringPtr *this_local;
  
  this_00 = (ArrayPtr<const_char> *)CONCAT71(in_register_00000031,c);
  i._7_1_ = in_DL;
  pAStack_18 = this_00;
  this_local = this;
  local_28 = size((StringPtr *)this_00);
  do {
    if (local_28 == 0) {
      Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,(void *)0x0);
      aVar2 = extraout_RDX_00;
LAB_0092b40c:
      MVar3.ptr.field_1.value = aVar2.value;
      MVar3.ptr._0_8_ = this;
      return (Maybe<unsigned_long>)MVar3.ptr;
    }
    pcVar1 = ArrayPtr<const_char>::operator[](this_00,local_28 - 1);
    if (*pcVar1 == i._7_1_) {
      local_30 = local_28 - 1;
      Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,&local_30);
      aVar2 = extraout_RDX;
      goto LAB_0092b40c;
    }
    local_28 = local_28 - 1;
  } while( true );
}

Assistant:

inline Maybe<size_t> StringPtr::findLast(char c) const {
  for (size_t i = size(); i > 0; --i) {
    if (content[i-1] == c) {
      return i-1;
    }
  }
  return nullptr;
}